

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status_internal.cc
# Opt level: O1

Nonnull<StatusRep_*> __thiscall
absl::lts_20250127::status_internal::StatusRep::CloneAndUnref(StatusRep *this)

{
  StatusCode SVar1;
  InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>
  *allocator;
  pointer pcVar2;
  size_type sVar3;
  _Head_base<0UL,_absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>_*,_false>
  this_00;
  Storage<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>
  *this_01;
  Nonnull<StatusRep_*> pSVar4;
  pointer __p;
  bool bVar5;
  unique_ptr<absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>,_std::default_delete<absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>_>_>
  payloads;
  _Head_base<0UL,_absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>_*,_false>
  local_30;
  _Head_base<0UL,_absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>_*,_false>
  local_28;
  __uniq_ptr_impl<absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>,_std::default_delete<absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>_>_>
  local_20;
  
  if ((this->ref_).super___atomic_base<int>._M_i != 1) {
    local_30._M_head_impl =
         (InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>
          *)0x0;
    allocator = (this->payloads_)._M_t.
                super___uniq_ptr_impl<absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>,_std::default_delete<absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>_*,_std::default_delete<absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>_>_>
                .
                super__Head_base<0UL,_absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>_*,_false>
                ._M_head_impl;
    if (allocator !=
        (InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>
         *)0x0) {
      this_01 = (Storage<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>
                 *)operator_new(0x38);
      InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>
      ::InlinedVector((InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>
                       *)this_01,allocator,(allocator_type *)allocator);
      this_00._M_head_impl = local_30._M_head_impl;
      local_20._M_t.
      super__Tuple_impl<0UL,_absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>_*,_std::default_delete<absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>_>_>
      .
      super__Head_base<0UL,_absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>_*,_false>
      ._M_head_impl =
           (tuple<absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>_*,_std::default_delete<absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>_>_>
            )(_Tuple_impl<0UL,_absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>_*,_std::default_delete<absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>_>_>
              )0x0;
      bVar5 = &(local_30._M_head_impl)->storage_ !=
              (Storage<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>
               *)0x0;
      local_30._M_head_impl =
           (InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>
            *)this_01;
      if (bVar5) {
        inlined_vector_internal::
        Storage<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>
        ::~Storage(&(this_00._M_head_impl)->storage_);
        operator_delete(this_00._M_head_impl,0x38);
      }
      std::
      unique_ptr<absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>,_std::default_delete<absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>_>_>
      ::~unique_ptr((unique_ptr<absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>,_std::default_delete<absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>_>_>
                     *)&local_20);
    }
    pSVar4 = (Nonnull<StatusRep_*>)operator_new(0x30);
    SVar1 = this->code_;
    pcVar2 = (this->message_)._M_dataplus._M_p;
    sVar3 = (this->message_)._M_string_length;
    local_28._M_head_impl = local_30._M_head_impl;
    local_30._M_head_impl =
         (InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>
          *)0x0;
    (pSVar4->ref_).super___atomic_base<int>._M_i = 1;
    pSVar4->code_ = SVar1;
    (pSVar4->message_)._M_dataplus._M_p = (pointer)&(pSVar4->message_).field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&pSVar4->message_,pcVar2,pcVar2 + sVar3);
    (pSVar4->payloads_)._M_t.
    super___uniq_ptr_impl<absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>,_std::default_delete<absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>_*,_std::default_delete<absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>_>_>
    .
    super__Head_base<0UL,_absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>_*,_false>
    ._M_head_impl = local_28._M_head_impl;
    local_28._M_head_impl =
         (InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>
          *)0x0;
    std::
    unique_ptr<absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>,_std::default_delete<absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>_>_>
    ::~unique_ptr((unique_ptr<absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>,_std::default_delete<absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>_>_>
                   *)&local_28);
    Unref(this);
    std::
    unique_ptr<absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>,_std::default_delete<absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>_>_>
    ::~unique_ptr((unique_ptr<absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>,_std::default_delete<absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>_>_>
                   *)&local_30);
    this = pSVar4;
  }
  return this;
}

Assistant:

absl::Nonnull<StatusRep*> StatusRep::CloneAndUnref() const {
  // Optimization: no need to create a clone if we already have a refcount of 1.
  if (ref_.load(std::memory_order_acquire) == 1) {
    // All StatusRep instances are heap allocated and mutable, therefore this
    // const_cast will never cast away const from a stack instance.
    //
    // CloneAndUnref is the only method that doesn't involve an external cast to
    // get a mutable StatusRep* from the uintptr_t rep stored in Status.
    return const_cast<StatusRep*>(this);
  }
  std::unique_ptr<status_internal::Payloads> payloads;
  if (payloads_) {
    payloads = absl::make_unique<status_internal::Payloads>(*payloads_);
  }
  auto* new_rep = new StatusRep(code_, message_, std::move(payloads));
  Unref();
  return new_rep;
}